

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tokenizer-0.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  istream *piVar4;
  int *piVar5;
  mapped_type *this;
  ostream *poVar6;
  undefined8 extraout_RAX;
  long lVar7;
  long lVar8;
  int iVar9;
  string *psVar10;
  undefined8 *puVar11;
  char *pcVar12;
  undefined8 *puVar13;
  pointer pcVar14;
  long *plVar15;
  ulong uVar16;
  value_type *unaff_R15;
  iterator __begin2;
  value_type *pvVar17;
  bool bVar18;
  byte bVar19;
  bool success;
  string fname_inp;
  string fname_text;
  string fname_out;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  size_type __dnew;
  string sraw;
  llama_context *ctx;
  vector<int,_std::allocator<int>_> toks;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  sinp;
  string fname;
  llama_tests k_tests;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  sout;
  string stok;
  llama_context_params cparams;
  llama_model_params mparams;
  undefined8 auStack_688 [16];
  byte local_601;
  value_type *local_600;
  long *local_5f8 [2];
  long local_5e8 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5d8;
  long *local_5b8 [2];
  long local_5a8 [2];
  pointer local_598;
  value_type local_590;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_570;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_550;
  long local_530;
  llama_context *local_528;
  uint local_520;
  int local_51c;
  vector<int,_std::allocator<int>_> local_518;
  value_type local_4f8;
  long *local_4d8;
  long local_4d0;
  long local_4c8 [2];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
  local_4b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_488;
  value_type *local_468 [2];
  undefined1 local_458 [16];
  undefined1 local_448 [8];
  undefined1 local_440 [32];
  uint auStack_420 [50];
  undefined8 auStack_358 [36];
  string local_238;
  byte abStack_218 [32];
  undefined1 local_1f8;
  
  bVar19 = 0;
  if (argc < 2) {
    main_cold_9();
    return 1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4d8,argv[1],(allocator<char> *)(local_448 + 8));
  local_5f8[0] = local_5e8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_5f8,local_4d8,local_4d0 + (long)local_4d8);
  std::__cxx11::string::append((char *)local_5f8);
  local_5b8[0] = local_5a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_5b8,local_4d8,local_4d0 + (long)local_4d8);
  std::__cxx11::string::append((char *)local_5b8);
  local_5d8._M_dataplus._M_p = (pointer)&local_5d8.field_2;
  local_5d8._M_string_length = 0;
  local_5d8.field_2._M_local_buf[0] = '\0';
  if (argc != 2) {
    pcVar12 = argv[2];
    strlen(pcVar12);
    std::__cxx11::string::_M_replace((ulong)&local_5d8,0,(char *)0x0,(ulong)pcVar12);
  }
  fprintf(_stderr,"%s : reading vocab from: \'%s\'\n","main",local_4d8);
  llama_backend_init();
  llama_model_default_params(&local_238);
  plVar15 = local_4d8;
  local_1f8 = 1;
  psVar10 = &local_238;
  puVar11 = auStack_688;
  for (lVar7 = 9; lVar7 != 0; lVar7 = lVar7 + -1) {
    *puVar11 = (psVar10->_M_dataplus)._M_p;
    psVar10 = (string *)((long)psVar10 + ((ulong)bVar19 * -2 + 1) * 8);
    puVar11 = puVar11 + (ulong)bVar19 * -2 + 1;
  }
  lVar7 = llama_model_load_from_file(plVar15);
  if (lVar7 == 0) {
    fprintf(_stderr,"%s: error: failed to load vocab \'%s\'\n","main",local_4d8);
  }
  else {
    llama_context_default_params(local_448 + 8);
    puVar11 = (undefined8 *)(local_448 + 8);
    puVar13 = auStack_688;
    for (lVar8 = 0xf; lVar8 != 0; lVar8 = lVar8 + -1) {
      *puVar13 = *puVar11;
      puVar11 = puVar11 + (ulong)bVar19 * -2 + 1;
      puVar13 = puVar13 + (ulong)bVar19 * -2 + 1;
    }
    local_528 = (llama_context *)llama_init_from_model(lVar7);
    if (local_528 != (llama_context *)0x0) {
      local_601 = 1;
      local_4b8._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_4b8._M_impl.super__Rb_tree_header._M_header;
      local_530 = lVar7;
      local_4b8._M_impl.super__Rb_tree_header._M_header._M_right =
           local_4b8._M_impl.super__Rb_tree_header._M_header._M_left;
      if (local_5d8._M_string_length == 0) {
        local_4b8._M_impl.super__Rb_tree_header._M_header._0_8_ =
             local_4b8._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
        local_4b8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_4b8._M_impl.super__Rb_tree_header._M_node_count = 0;
        std::ifstream::ifstream(local_448 + 8,(string *)local_5f8,_S_in);
        if ((*(byte *)((long)auStack_420 + *(long *)(local_440._0_8_ + -0x18)) & 5) == 0) {
          local_550._M_dataplus._M_p = (pointer)&local_550.field_2;
          std::__cxx11::string::_M_construct<std::istreambuf_iterator<char,std::char_traits<char>>>
                    ((string *)&local_550,
                     *(undefined8 *)((long)auStack_358 + *(long *)(local_440._0_8_ + -0x18)),
                     0xffffffff,0,0xffffffff);
          std::ifstream::ifstream(&local_238,(string *)local_5b8,_S_in);
          if ((abStack_218[*(long *)(local_238._M_dataplus._M_p + -0x18)] & 5) == 0) {
            local_488.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_488.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_488.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_590._M_dataplus._M_p = (pointer)&local_590.field_2;
            local_590._M_string_length = 0;
            local_590.field_2._M_allocated_capacity =
                 local_590.field_2._M_allocated_capacity & 0xffffffffffffff00;
            unaff_R15 = &local_590;
            while( true ) {
              cVar1 = std::ios::widen((char)*(undefined8 *)(local_238._M_dataplus._M_p + -0x18) +
                                      (char)&local_238);
              piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                                 ((istream *)&local_238,(string *)unaff_R15,cVar1);
              if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) break;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(&local_488,unaff_R15);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_590._M_dataplus._M_p != &local_590.field_2) {
              operator_delete(local_590._M_dataplus._M_p,local_590.field_2._M_allocated_capacity + 1
                             );
            }
            local_590._M_dataplus._M_p = (pointer)&local_590.field_2;
            local_570._M_dataplus._M_p = (pointer)0x15;
            local_590._M_dataplus._M_p =
                 (pointer)std::__cxx11::string::_M_create((ulong *)&local_590,(ulong)&local_570);
            local_590.field_2._M_allocated_capacity = (size_type)local_570._M_dataplus._M_p;
            builtin_strncpy(local_590._M_dataplus._M_p,"\n__ggml_vocab_test__\n",0x15);
            local_590._M_string_length = (size_type)local_570._M_dataplus._M_p;
            local_590._M_dataplus._M_p[(long)local_570._M_dataplus._M_p] = '\0';
            local_4f8._M_dataplus._M_p = (pointer)0x0;
            local_4f8._M_string_length = 0;
            local_4f8.field_2._M_allocated_capacity = 0;
            if ((pointer)local_550._M_string_length != (pointer)0x0) {
              pcVar14 = (pointer)0x0;
              unaff_R15 = &local_4f8;
              do {
                lVar7 = std::__cxx11::string::find
                                  ((char *)&local_550,(ulong)local_590._M_dataplus._M_p,
                                   (ulong)pcVar14);
                if (lVar7 == -1) {
                  std::__cxx11::string::substr((ulong)&local_570,(ulong)&local_550);
                  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                  emplace_back<std::__cxx11::string>
                            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                             &local_4f8,&local_570);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_570._M_dataplus._M_p != &local_570.field_2) {
                    operator_delete(local_570._M_dataplus._M_p,
                                    local_570.field_2._M_allocated_capacity + 1);
                  }
                  break;
                }
                std::__cxx11::string::substr((ulong)&local_570,(ulong)&local_550);
                std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                emplace_back<std::__cxx11::string>
                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           unaff_R15,&local_570);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_570._M_dataplus._M_p != &local_570.field_2) {
                  operator_delete(local_570._M_dataplus._M_p,
                                  local_570.field_2._M_allocated_capacity + 1);
                }
                pcVar14 = (pointer)(local_590._M_string_length + lVar7);
              } while (pcVar14 < local_550._M_string_length);
            }
            if (local_4f8._M_string_length - (long)local_4f8._M_dataplus._M_p ==
                (long)local_488.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_488.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start) {
              if ((pointer)local_4f8._M_string_length != local_4f8._M_dataplus._M_p) {
                plVar15 = (long *)0x0;
                do {
                  local_598 = local_4f8._M_dataplus._M_p;
                  local_600 = (value_type *)plVar15;
                  string_strip(&local_570,
                               local_488.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + (long)plVar15);
                  local_518.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start = (pointer)0x0;
                  local_518.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish = (int *)0x0;
                  local_518.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage = (int *)0x0;
                  if (local_570._M_string_length != 0) {
                    do {
                      uVar16 = std::__cxx11::string::find((char)&local_570,0x20);
                      if (uVar16 == 0xffffffffffffffff) {
                        uVar16 = local_570._M_string_length;
                      }
                      std::__cxx11::string::substr((ulong)local_468,(ulong)&local_570);
                      unaff_R15 = local_468[0];
                      piVar5 = __errno_location();
                      iVar9 = *piVar5;
                      *piVar5 = 0;
                      lVar7 = strtol((char *)unaff_R15,(char **)local_448,10);
                      if (local_448 == (undefined1  [8])unaff_R15) {
                        std::__throw_invalid_argument("stoi");
LAB_00116fba:
                        std::__throw_out_of_range("stoi");
                        goto LAB_00116fc6;
                      }
                      iVar2 = (int)lVar7;
                      if ((iVar2 != lVar7) || (*piVar5 == 0x22)) goto LAB_00116fba;
                      if (*piVar5 == 0) {
                        *piVar5 = iVar9;
                      }
                      local_51c = iVar2;
                      if (local_518.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish ==
                          local_518.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage) {
                        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                                  (&local_518,
                                   (iterator)
                                   local_518.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_finish,&local_51c);
                      }
                      else {
                        *local_518.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish = iVar2;
                        local_518.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish =
                             local_518.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish + 1;
                      }
                      if (local_468[0] != (value_type *)local_458) {
                        operator_delete(local_468[0],(ulong)(local_458._0_8_ + 1));
                      }
                    } while (uVar16 + 1 < local_570._M_string_length);
                  }
                  this = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                         ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                                       *)&local_4b8,(key_type *)(local_598 + (long)plVar15 * 0x20));
                  std::vector<int,_std::allocator<int>_>::operator=(this,&local_518);
                  if (local_518.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(local_518.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start,
                                    (long)local_518.super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)local_518.super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_start);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_570._M_dataplus._M_p != &local_570.field_2) {
                    operator_delete(local_570._M_dataplus._M_p,
                                    local_570.field_2._M_allocated_capacity + 1);
                  }
                  plVar15 = (long *)((long)local_600 + 1);
                } while (plVar15 < (long *)((long)(local_4f8._M_string_length -
                                                  (long)local_4f8._M_dataplus._M_p) >> 5));
              }
            }
            else {
              main_cold_3();
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_4f8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_590._M_dataplus._M_p != &local_590.field_2) {
              operator_delete(local_590._M_dataplus._M_p,
                              (ulong)(local_590.field_2._M_allocated_capacity + 1));
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_488);
            lVar7 = local_530;
          }
          else {
            main_cold_2();
          }
          std::ifstream::~ifstream(&local_238);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_550._M_dataplus._M_p != &local_550.field_2) {
            operator_delete(local_550._M_dataplus._M_p,local_550.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          main_cold_1();
        }
        std::ifstream::~ifstream(local_448 + 8);
        if (local_4b8._M_impl.super__Rb_tree_header._M_node_count == 0) {
          main_cold_8();
          local_600 = unaff_R15;
          if (unaff_R15 != (value_type *)0x0) {
            operator_delete(unaff_R15,(long)local_598 - (long)unaff_R15);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p != &local_238.field_2) {
            operator_delete(local_238._M_dataplus._M_p,
                            CONCAT71(local_238.field_2._M_allocated_capacity._1_7_,
                                     local_238.field_2._M_local_buf[0]) + 1);
          }
          std::vector<std::thread,_std::allocator<std::thread>_>::~vector
                    ((vector<std::thread,_std::allocator<std::thread>_> *)&local_590);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
          ::~_Rb_tree(&local_4b8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_5d8._M_dataplus._M_p != &local_5d8.field_2) {
            operator_delete(local_5d8._M_dataplus._M_p,
                            CONCAT71(local_5d8.field_2._M_allocated_capacity._1_7_,
                                     local_5d8.field_2._M_local_buf[0]) + 1);
          }
          if (local_5b8[0] != local_5a8) {
            operator_delete(local_5b8[0],local_5a8[0] + 1);
          }
          if (local_5f8[0] != local_5e8) {
            operator_delete(local_5f8[0],local_5e8[0] + 1);
          }
          if (local_4d8 != local_4c8) {
            operator_delete(local_4d8,local_4c8[0] + 1);
          }
          _Unwind_Resume(extraout_RAX);
        }
      }
      else {
        local_4b8._M_impl._0_8_ = 0;
        local_4b8._M_impl.super__Rb_tree_header._M_header._0_8_ = 0;
        local_4b8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_4b8._M_impl.super__Rb_tree_header._M_node_count = 0;
      }
      uVar3 = std::thread::hardware_concurrency();
      std::vector<std::thread,_std::allocator<std::thread>_>::vector
                ((vector<std::thread,_std::allocator<std::thread>_> *)&local_590,(long)(int)uVar3,
                 (allocator_type *)(local_448 + 8));
      if (0 < (int)uVar3) {
        local_598 = (pointer)CONCAT44(local_598._4_4_,uVar3);
        uVar16 = 0;
        do {
          local_238._M_dataplus._M_p = (pointer)0x0;
          local_440._0_8_ = operator_new(0x28);
          *(undefined ***)local_440._0_8_ = &PTR___State_0013b940;
          *(int *)(local_440._0_8_ + 8) = (int)uVar16;
          *(_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
            **)(local_440._0_8_ + 0x10) = &local_4b8;
          *(llama_context ***)(local_440._0_8_ + 0x18) = &local_528;
          *(byte **)(local_440._0_8_ + 0x20) = &local_601;
          std::thread::_M_start_thread(&local_238,local_448 + 8,0);
          if ((long *)local_440._0_8_ != (long *)0x0) {
            (**(code **)(*(long *)local_440._0_8_ + 8))();
          }
          lVar7 = local_530;
          if (*(long *)(local_590._M_dataplus._M_p + uVar16 * 8) != 0) {
LAB_00116fc6:
            std::terminate();
          }
          *(pointer *)(local_590._M_dataplus._M_p + uVar16 * 8) = local_238._M_dataplus._M_p;
          uVar16 = uVar16 + 1;
        } while (uVar3 != uVar16);
        if (0 < (int)local_598) {
          lVar8 = 0;
          do {
            std::thread::join();
            lVar8 = lVar8 + 8;
          } while ((ulong)uVar3 << 3 != lVar8);
        }
      }
      if (local_5d8._M_string_length == 0) {
LAB_00116ac6:
        llama_model_free(lVar7);
        llama_free(local_528);
        llama_backend_free();
        putchar(10);
        pcVar12 = "failed";
        if (local_601 != 0) {
          pcVar12 = "passed";
        }
        printf("Tests %s\n",pcVar12);
        iVar9 = (local_601 ^ 1) * 3;
      }
      else {
        fprintf(_stderr,"%s : tokenizing: \'%s\'\n","main",local_5d8._M_dataplus._M_p);
        local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
        local_238._M_string_length = 0;
        local_238.field_2._M_local_buf[0] = '\0';
        std::ifstream::ifstream(local_448 + 8,(string *)&local_5d8,_S_in);
        if ((*(byte *)((long)auStack_420 + *(long *)(local_440._0_8_ + -0x18)) & 5) == 0) {
          local_550._M_dataplus._M_p = (pointer)&local_550.field_2;
          std::__cxx11::string::_M_construct<std::istreambuf_iterator<char,std::char_traits<char>>>
                    ((string *)&local_550,
                     *(undefined8 *)((long)auStack_358 + *(long *)(local_440._0_8_ + -0x18)),
                     0xffffffff,0);
          main_cold_5();
          std::ifstream::~ifstream(local_448 + 8);
          fprintf(_stderr,"%s : text size: %zu\n","main");
          lVar7 = ggml_time_us();
          common_tokenize((vector<int,_std::allocator<int>_> *)(local_448 + 8),local_528,&local_238,
                          false,false);
          pvVar17 = (value_type *)local_440._0_8_;
          local_598 = (pointer)local_440._16_8_;
          lVar8 = ggml_time_us();
          fprintf(_stderr,"%s : tokenized in %.3f ms (cpp)\n",(double)(lVar8 - lVar7) / 1000.0,
                  "main");
          fprintf(_stderr,"%s : tokens: %zu\n","main",local_440._8_8_ - (long)pvVar17 >> 2);
          std::operator+(&local_550,&local_5d8,".tokcpp");
          std::ofstream::ofstream(local_448 + 8,(string *)&local_550,_S_out);
          uVar3 = *(uint *)((long)auStack_420 + *(long *)(local_440._0_8_ + -0x18));
          bVar18 = (uVar3 & 5) == 0;
          uVar16 = CONCAT71(0x12f0,bVar18);
          if (bVar18) {
            iVar9 = 0;
            if (pvVar17 != (value_type *)local_440._8_8_) {
              local_520 = (uint)uVar16;
              local_600 = pvVar17;
              do {
                poVar6 = (ostream *)
                         std::ostream::operator<<((ostream *)(local_448 + 8),(int)*(long *)pvVar17);
                std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
                pvVar17 = (value_type *)((long)pvVar17 + 4);
              } while (pvVar17 != (value_type *)local_440._8_8_);
              uVar16 = (ulong)local_520;
              pvVar17 = local_600;
            }
          }
          else {
            main_cold_6();
            iVar9 = 1;
          }
          cVar1 = (char)uVar16;
          std::ofstream::~ofstream(local_448 + 8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_550._M_dataplus._M_p != &local_550.field_2) {
            operator_delete(local_550._M_dataplus._M_p,local_550.field_2._M_allocated_capacity + 1);
          }
          lVar7 = local_530;
          if ((uVar3 & 5) == 0) {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (local_448 + 8),&local_5d8,".tokcpp");
            main_cold_7();
          }
          if (pvVar17 != (value_type *)0x0) {
            operator_delete(pvVar17,(long)local_598 - (long)pvVar17);
          }
        }
        else {
          main_cold_4();
          iVar9 = 1;
          cVar1 = '\0';
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != &local_238.field_2) {
          operator_delete(local_238._M_dataplus._M_p,
                          CONCAT71(local_238.field_2._M_allocated_capacity._1_7_,
                                   local_238.field_2._M_local_buf[0]) + 1);
        }
        if (cVar1 != '\0') goto LAB_00116ac6;
      }
      std::vector<std::thread,_std::allocator<std::thread>_>::~vector
                ((vector<std::thread,_std::allocator<std::thread>_> *)&local_590);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
      ::~_Rb_tree(&local_4b8);
      goto LAB_00116b3a;
    }
    fprintf(_stderr,"%s: error: failed to load vocab \'%s\'\n","main",local_4d8);
    llama_model_free(lVar7);
  }
  iVar9 = 1;
LAB_00116b3a:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d8._M_dataplus._M_p != &local_5d8.field_2) {
    operator_delete(local_5d8._M_dataplus._M_p,
                    CONCAT71(local_5d8.field_2._M_allocated_capacity._1_7_,
                             local_5d8.field_2._M_local_buf[0]) + 1);
  }
  if (local_5b8[0] != local_5a8) {
    operator_delete(local_5b8[0],local_5a8[0] + 1);
  }
  if (local_5f8[0] != local_5e8) {
    operator_delete(local_5f8[0],local_5e8[0] + 1);
  }
  if (local_4d8 != local_4c8) {
    operator_delete(local_4d8,local_4c8[0] + 1);
  }
  return iVar9;
}

Assistant:

int main(int argc, char **argv) {
    if (argc < 2) {
        fprintf(stderr, "Usage: %s vocab-file [text-file]\n", argv[0]);
        return 1;
    }

    const std::string fname = argv[1];

    const std::string fname_inp = fname + ".inp";
    const std::string fname_out = fname + ".out";

    std::string fname_text;
    if (argc > 2) {
        fname_text = argv[2];
    }

    fprintf(stderr, "%s : reading vocab from: '%s'\n", __func__, fname.c_str());

    llama_model * model;
    llama_context * ctx;

    llama_backend_init();

    // load the vocab
    {
        auto mparams = llama_model_default_params();

        mparams.vocab_only = true;

        model = llama_model_load_from_file(fname.c_str(), mparams);

        if (model == NULL) {
            fprintf(stderr, "%s: error: failed to load vocab '%s'\n", __func__, fname.c_str());
            return 1;
        }

        auto cparams = llama_context_default_params();

        ctx = llama_init_from_model(model, cparams);

        if (ctx == NULL) {
            fprintf(stderr, "%s: error: failed to load vocab '%s'\n", __func__, fname.c_str());
            llama_model_free(model);
            return 1;
        }
    }

#ifdef _WIN32
    // We need this for unicode console support
    console::init(false, false);
    atexit([]() { console::cleanup(); });
#endif

    bool success = true;

    const auto k_tests = [&]() -> llama_tests {
        if (!fname_text.empty()) {
            return {};
        }

        const auto res = read_tests(fname_inp, fname_out);

        if (res.empty()) {
            fprintf(stderr, "%s : error: no tests found\n", __func__);
            exit(1);
        }

        return res;
    }();

    const bool add_special = false;

    // multi-threaded tokenization
    const int nthread = std::thread::hardware_concurrency();
    std::vector<std::thread> threads(nthread);

    for (int i = 0; i < nthread; i++) {
        threads[i] = std::thread([&, i]() {
            for (const auto & test_kv : k_tests) {
                const std::vector<llama_token> res = common_tokenize(ctx, test_kv.first, add_special, false);

                // here only print the result of the first thread
                // because the other threads are running the same tests
                if (i != 0) {
                    continue;
                }

                printf("\n");
                printf("src: '%s'\n", test_kv.first.c_str());
                printf("res: '%s'\n", common_detokenize(ctx, res).c_str());
                printf("tok: ");
                for (const auto & tok : res) {
                    printf("%d ", tok);
                }
                printf("\n");

                bool correct = res.size() == test_kv.second.size();
                for (int i = 0; i < (int) res.size() && correct; ++i) {
                    if (test_kv.second[i] != res[i]) {
                        correct = false;
                    }
                }

                if (!correct) {
                    fprintf(stderr, "%s : failed test:    '%s'\n", __func__, test_kv.first.c_str());
                    fprintf(stderr, "%s : detokenized to: '%s' instead of '%s'\n", __func__,
                        common_detokenize(ctx, res).c_str(),
                        common_detokenize(ctx, test_kv.second).c_str());
                    fprintf(stderr, "%s : expected tokens: ", __func__);
                    for (const auto & t : test_kv.second) {
                        fprintf(stderr, "%6d '%s', ", t, common_token_to_piece(ctx, t).c_str());
                    }
                    fprintf(stderr, "\n");
                    fprintf(stderr, "%s : got tokens:      ", __func__);
                    for (const auto & t : res) {
                        fprintf(stderr, "%6d '%s', ", t, common_token_to_piece(ctx, t).c_str());
                    }
                    fprintf(stderr, "\n");

                    success = false;
                }
            }
        });
    }

    for (int i = 0; i < nthread; i++) {
        threads[i].join();
    }

    // single threaded tokenization
    if (!fname_text.empty()) {
        fprintf(stderr, "%s : tokenizing: '%s'\n", __func__, fname_text.c_str());

        std::string text;
        {
            std::ifstream ifs(fname_text);
            if (!ifs) {
                fprintf(stderr, "%s : error: could not open file '%s'\n", __func__, fname_text.c_str());
                return 1;
            }
            text = std::string(std::istreambuf_iterator<char>(ifs), std::istreambuf_iterator<char>());
        }

        fprintf(stderr, "%s : text size: %zu\n", __func__, text.size());

        std::vector<llama_token> res;

        {
            const auto t_start = ggml_time_us();

            res = common_tokenize(ctx, text, add_special, false);

            const auto t_end = ggml_time_us();

            fprintf(stderr, "%s : tokenized in %.3f ms (cpp)\n", __func__, (t_end - t_start) / 1000.0);
        }

        fprintf(stderr, "%s : tokens: %zu\n", __func__, res.size());

        {
            const std::string fname_out = fname_text + ".tokcpp";

            std::ofstream ofs(fname_out);
            if (!ofs) {
                fprintf(stderr, "%s : error: could not open file '%s'\n", __func__, fname_out.c_str());
                return 1;
            }

            for (const auto & tok : res) {
                //ofs << tok << " '" << string_strip(llama_detokenize(ctx, std::vector<int>{tok})) << "'" << std::endl;
                ofs << tok << "\n";
            }
        }

        fprintf(stderr, "%s : tokens written to '%s'\n", __func__, (fname_text + ".tokcpp").c_str());
    }

    llama_model_free(model);
    llama_free(ctx);

    llama_backend_free();

    printf("\n");
    printf("Tests %s\n", success ? "passed" : "failed");

    return success ? 0 : 3;
}